

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

bool __thiscall glslang::TIntermediate::addUsedConstantId(TIntermediate *this,int id)

{
  iterator iVar1;
  __hashtable *__h;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *this_00;
  __node_gen_type __node_gen;
  int local_1c;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_18;
  
  this_00 = &this->usedConstantId;
  local_1c = id;
  iVar1 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&local_1c);
  if (iVar1.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
    local_18 = this_00;
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00,&local_1c);
  }
  return iVar1.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0;
}

Assistant:

bool TIntermediate::addUsedConstantId(int id)
{
    if (usedConstantId.find(id) != usedConstantId.end())
        return false;

    usedConstantId.insert(id);

    return true;
}